

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ParserResult * Catch::Clara::Detail::convertInto(string *source,bool *target)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  char __rhs;
  undefined1 *in_RDX;
  ParserResult *in_RDI;
  string srcLC;
  string *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  string local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_68 [48];
  string local_38 [32];
  undefined1 *local_18;
  
  local_18 = in_RDX;
  toLower((string *)in_RDI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                          (char *)in_stack_ffffffffffffff38);
  if (bVar1) {
LAB_001858bb:
    *local_18 = 1;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if ((bool)uVar2) goto LAB_001858bb;
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if ((bool)uVar3) goto LAB_001858bb;
    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if ((bool)uVar4) goto LAB_001858bb;
    uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if ((bool)uVar5) goto LAB_001858bb;
    uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if (!(bool)uVar6) {
      uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                              (char *)in_stack_ffffffffffffff38);
      if (!(bool)uVar7) {
        uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                (char *)in_stack_ffffffffffffff38);
        if (!(bool)uVar8) {
          uVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                  (char *)in_stack_ffffffffffffff38);
          if (!(bool)uVar9) {
            __rhs = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
                                    ,(char *)in_stack_ffffffffffffff38);
            if (!(bool)__rhs) {
              std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                             __rhs);
              BasicResult<Catch::Clara::ParseResultType>::runtimeError(in_stack_ffffffffffffff38);
              std::__cxx11::string::~string(local_68);
              std::__cxx11::string::~string(local_88);
              goto LAB_00185a6f;
            }
          }
        }
      }
    }
    *local_18 = 0;
  }
  BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
            ((ParseResultType *)in_stack_ffffffffffffff38);
LAB_00185a6f:
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

ParserResult convertInto( std::string const& source,
                                      bool& target ) {
                std::string srcLC = toLower( source );

                if ( srcLC == "y" || srcLC == "1" || srcLC == "true" ||
                     srcLC == "yes" || srcLC == "on" ) {
                    target = true;
                } else if ( srcLC == "n" || srcLC == "0" || srcLC == "false" ||
                            srcLC == "no" || srcLC == "off" ) {
                    target = false;
                } else {
                    return ParserResult::runtimeError(
                        "Expected a boolean value but did not recognise: '" +
                        source + '\'' );
                }
                return ParserResult::ok( ParseResultType::Matched );
            }